

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<char>_> *this)

{
  char cVar1;
  char cVar2;
  num_writer f;
  int iVar3;
  int iVar4;
  int num_digits;
  size_type sVar5;
  int iVar6;
  string_view prefix;
  string groups;
  undefined4 uStack_4c;
  undefined7 uStack_3f;
  string local_38;
  
  grouping_impl<char>(&local_38,(locale_ref)(this->writer->locale_).locale_);
  if (local_38._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar1 = this->specs->thousands;
    if (cVar1 == '\0') {
      on_dec(this);
    }
    else {
      iVar3 = count_digits(this->abs_value);
      num_digits = (int)local_38._M_string_length + iVar3;
      iVar4 = iVar3;
      for (sVar5 = 0; local_38._M_string_length != sVar5; sVar5 = sVar5 + 1) {
        cVar2 = local_38._M_dataplus._M_p[sVar5];
        iVar6 = iVar4 - cVar2;
        if ((iVar6 == 0 || iVar4 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) {
          num_digits = iVar3 + (int)sVar5;
          if (local_38._M_string_length != sVar5) goto LAB_0165da1f;
          break;
        }
        iVar4 = iVar6;
      }
      num_digits = (iVar4 + -1) / (int)local_38._M_dataplus._M_p[local_38._M_string_length - 1] +
                   num_digits;
LAB_0165da1f:
      f._12_4_ = uStack_4c;
      f.size = num_digits;
      f._25_7_ = uStack_3f;
      f.sep = cVar1;
      f.abs_value = this->abs_value;
      f.groups = &local_38;
      prefix.size_._0_4_ = this->prefix_size;
      prefix.data_ = this->prefix;
      prefix.size_._4_4_ = 0;
      basic_writer<duckdb_fmt::v6::buffer_range<char>>::
      write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<long_long,duckdb_fmt::v6::basic_format_specs<char>>::num_writer>
                ((basic_writer<duckdb_fmt::v6::buffer_range<char>> *)this->writer,num_digits,prefix,
                 *this->specs,f);
    }
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = specs.thousands;
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, static_cast<char_type>(sep)});
    }